

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O1

LayoutBindingTestResult * __thiscall
glcts::LayoutBindingBaseCase::binding_api_update
          (LayoutBindingTestResult *__return_storage_ptr__,LayoutBindingBaseCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Base_ptr *pp_Var2;
  undefined1 *this_00;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar6;
  LayoutBindingProgram *this_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  mapped_type_conflict *pmVar7;
  _Alloc_hider _Var8;
  StringIntMap bindingPoints;
  allocator<char> local_32a;
  allocator<char> local_329;
  undefined1 local_328 [32];
  _Base_ptr p_Stack_308;
  size_t local_300;
  StringVector list;
  String local_2d0;
  String local_2b0;
  long *local_290 [2];
  long local_280 [2];
  String local_270;
  long *local_250 [2];
  long local_240 [2];
  String decl;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_210;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e0;
  String local_1c8;
  StringStream s;
  undefined4 extraout_var_01;
  
  iVar4 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s,*(char **)CONCAT44(extraout_var,iVar4),&local_329);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1a])
            (&bindingPoints,this,1);
  iVar4 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_328,*(char **)(CONCAT44(extraout_var_00,iVar4) + 0x18),&local_32a);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(&local_2d0,this,0);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
            (&local_2b0,this,&local_2d0);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(local_250,this,0);
  local_290[0] = local_280;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"float","");
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1d])
            ((String *)&list,this,local_250,local_290);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(&local_1c8,this,0);
  local_270._M_string_length = 0;
  local_270.field_2._M_local_buf[0] = '\0';
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  buildUniformDecl(&decl,this,(String *)&s,(String *)&bindingPoints,(String *)local_328,&local_2b0,
                   (String *)&list,&local_1c8,&local_270);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,
                    CONCAT71(local_270.field_2._M_allocated_capacity._1_7_,
                             local_270.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if (list.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)&list.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(list.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((list.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (local_290[0] != local_280) {
    operator_delete(local_290[0],local_280[0] + 1);
  }
  if (local_250[0] != local_240) {
    operator_delete(local_250[0],local_240[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,(ulong)(local_2d0.field_2._M_allocated_capacity + 1))
    ;
  }
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_328 + 0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._0_8_ != paVar1) {
    operator_delete((void *)local_328._0_8_,(ulong)(local_328._16_8_ + 1));
  }
  pp_Var2 = &bindingPoints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if ((_Base_ptr *)bindingPoints._M_t._M_impl._0_8_ != pp_Var2) {
    operator_delete((void *)bindingPoints._M_t._M_impl._0_8_,
                    (ulong)((long)&(bindingPoints._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  if (s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
      != (_func_int **)
         &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_
                    + 1);
  }
  setTemplateParam(this,(this->m_stage).type,"UNIFORM_DECL",&decl);
  this_00 = &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70;
  std::ios_base::ios_base((ios_base *)this_00);
  s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._112_8_ =
       glUniformMatrix3x2fv;
  s.super_ostringstream._328_8_ = 0;
  s.super_ostringstream._336_2_ = 0;
  s.super_ostringstream._344_8_ = 0;
  s.super_ostringstream._352_8_ = 0;
  s.super_ostringstream._360_8_ = 0;
  s.super_ostringstream._368_8_ = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
  s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)&PTR__StringStream_02143dd0;
  s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._112_8_ =
       &PTR__StringStream_02143df8;
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(local_328,this,0);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1b])
            (&bindingPoints,this,local_328);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&s,(char *)bindingPoints._M_t._M_impl._0_8_,
                      CONCAT44(bindingPoints._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                               bindingPoints._M_t._M_impl.super__Rb_tree_header._M_header._M_color))
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,";\n",2);
  if ((_Base_ptr *)bindingPoints._M_t._M_impl._0_8_ != pp_Var2) {
    operator_delete((void *)bindingPoints._M_t._M_impl._0_8_,
                    (ulong)((long)&(bindingPoints._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._0_8_ != paVar1) {
    operator_delete((void *)local_328._0_8_,(ulong)(local_328._16_8_ + 1));
  }
  std::__cxx11::stringbuf::str();
  setTemplateParam(this,(this->m_stage).type,"UNIFORM_ACCESS",(String *)&bindingPoints);
  if ((_Base_ptr *)bindingPoints._M_t._M_impl._0_8_ != pp_Var2) {
    operator_delete((void *)bindingPoints._M_t._M_impl._0_8_,
                    (ulong)((long)&(bindingPoints._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  updateTemplate(this,(this->m_stage).type);
  iVar4 = (*(this->super_IProgramContextSupplier)._vptr_IProgramContextSupplier[6])
                    (&this->super_IProgramContextSupplier);
  this_01 = (LayoutBindingProgram *)CONCAT44(extraout_var_01,iVar4);
  bVar3 = LayoutBindingProgram::compiledAndLinked(this_01);
  if (!bVar3) {
    LayoutBindingProgram::getErrorLog_abi_cxx11_((String *)&bindingPoints,this_01,false);
    __return_storage_ptr__->m_passed = false;
    __return_storage_ptr__->m_notRunForThisContext = false;
    (__return_storage_ptr__->m_reason)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_reason).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_reason,bindingPoints._M_t._M_impl._0_8_,
               CONCAT44(bindingPoints._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                        bindingPoints._M_t._M_impl.super__Rb_tree_header._M_header._M_color) +
               bindingPoints._M_t._M_impl._0_8_);
    if ((_Base_ptr *)bindingPoints._M_t._M_impl._0_8_ != pp_Var2) {
      operator_delete((void *)bindingPoints._M_t._M_impl._0_8_,
                      (ulong)((long)&(bindingPoints._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
    goto LAB_00bdf800;
  }
  list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
            (&bindingPoints,this,0);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
            (&local_2b0,this,&bindingPoints);
  if ((_Base_ptr *)bindingPoints._M_t._M_impl._0_8_ != pp_Var2) {
    operator_delete((void *)bindingPoints._M_t._M_impl._0_8_,
                    (ulong)((long)&(bindingPoints._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  if (local_2b0._M_string_length == 0) {
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
              (&bindingPoints,this,0);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&list,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bindingPoints);
  }
  else {
    bindingPoints._M_t._M_impl._0_8_ = pp_Var2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&bindingPoints,local_2b0._M_dataplus._M_p,
               local_2b0._M_dataplus._M_p + local_2b0._M_string_length);
    std::__cxx11::string::append((char *)&bindingPoints);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&list,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bindingPoints);
  }
  if ((_Base_ptr *)bindingPoints._M_t._M_impl._0_8_ != pp_Var2) {
    operator_delete((void *)bindingPoints._M_t._M_impl._0_8_,
                    (ulong)((long)&(bindingPoints._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1e0,&list);
  (*this_01->_vptr_LayoutBindingProgram[3])(&bindingPoints,this_01,&local_1e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1e0);
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_02,iVar4) + 0x1680))((this_01->m_program->m_program).m_program)
  ;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1f8,&list);
  iVar4 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x20])(this);
  (*this_01->_vptr_LayoutBindingProgram[4])(this_01,&local_1f8,(ulong)(iVar4 - 1));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1f8);
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_03,iVar4) + 0x1680))(0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_210,&list);
  (*this_01->_vptr_LayoutBindingProgram[3])(local_328,this_01,&local_210);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::clear(&bindingPoints._M_t);
  if ((_Base_ptr)local_328._16_8_ != (_Base_ptr)0x0) {
    bindingPoints._M_t._M_impl.super__Rb_tree_header._M_header._M_color = local_328._8_4_;
    bindingPoints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)local_328._16_8_;
    bindingPoints._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_328._24_8_
    ;
    bindingPoints._M_t._M_impl.super__Rb_tree_header._M_header._M_right = p_Stack_308;
    *(_Rb_tree_header **)(local_328._16_8_ + 8) = &bindingPoints._M_t._M_impl.super__Rb_tree_header;
    bindingPoints._M_t._M_impl.super__Rb_tree_header._M_node_count = local_300;
    local_328._16_8_ = (_Base_ptr)0x0;
    local_300 = 0;
    local_328._24_8_ = (_Base_ptr)(local_328 + 8);
    p_Stack_308 = (_Base_ptr)(local_328 + 8);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)local_328);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_210);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&bindingPoints,
                        list.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
  iVar4 = *pmVar7;
  iVar5 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x20])(this);
  if (iVar4 == iVar5 + -1) {
    local_328._8_8_ = 0;
    local_328._16_8_ = local_328._16_8_ & 0xffffffffffffff00;
    __return_storage_ptr__->m_passed = true;
    __return_storage_ptr__->m_notRunForThisContext = false;
    (__return_storage_ptr__->m_reason)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_reason).field_2;
    local_328._0_8_ = paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_reason,paVar1,paVar1);
    local_2d0.field_2._M_allocated_capacity = local_328._16_8_;
    _Var8._M_p = (pointer)local_328._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._0_8_ != paVar1) {
LAB_00bdf7bf:
      operator_delete(_Var8._M_p,
                      (ulong)((long)&((_Base_ptr)local_2d0.field_2._M_allocated_capacity)->_M_color
                             + 1));
    }
  }
  else {
    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2d0,"binding point did not match default","");
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&bindingPoints,
                          list.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar4 = *pmVar7;
    iVar5 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x20])(this);
    generateLog<int,int>((String *)local_328,this,&local_2d0,iVar4,iVar5 + -1);
    __return_storage_ptr__->m_passed = false;
    __return_storage_ptr__->m_notRunForThisContext = false;
    (__return_storage_ptr__->m_reason)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_reason).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_reason,local_328._0_8_,
               (char *)(local_328._0_8_ + local_328._8_8_));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._0_8_ != paVar1) {
      operator_delete((void *)local_328._0_8_,(ulong)(local_328._16_8_ + 1));
    }
    _Var8._M_p = local_2d0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) goto LAB_00bdf7bf;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&bindingPoints._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&list);
LAB_00bdf800:
  (*this_01->_vptr_LayoutBindingProgram[1])(this_01);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
  std::ios_base::~ios_base((ios_base *)this_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)decl._M_dataplus._M_p != &decl.field_2) {
    operator_delete(decl._M_dataplus._M_p,decl.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

LayoutBindingTestResult LayoutBindingBaseCase::binding_api_update(void)
{
	bool passed = true;

	String decl = buildUniformDecl(String(getTestParameters().keyword), buildLayout(1),
								   String(getTestParameters().uniform_type), buildBlockName(getDefaultUniformName()),
								   buildBlock(getDefaultUniformName()), getDefaultUniformName(), String());
	setTemplateParam("UNIFORM_DECL", decl);

	StringStream s;
	s << buildAccess(getDefaultUniformName()) << ";\n";
	setTemplateParam("UNIFORM_ACCESS", s.str());
	updateTemplate();

	LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
	passed &= program->compiledAndLinked();
	if (!passed)
	{
		return LayoutBindingTestResult(passed, program->getErrorLog());
	}

	StringVector  list;
	const String& u = buildBlockName(getDefaultUniformName());
	if (!u.empty())
		list.push_back(u + "_block");
	else
		list.push_back(getDefaultUniformName());

	StringIntMap bindingPoints = program->getBindingPoints(list);

	gl().useProgram(program->getProgram());
	program->setBindingPoints(list, maxBindings() - 1);
	gl().useProgram(0);

	bindingPoints = program->getBindingPoints(list);

	passed &= bindingPoints[list[0]] == (maxBindings() - 1);
	if (!passed)
	{
		return LayoutBindingTestResult(passed, generateLog(String("binding point did not match default"),
														   bindingPoints[list[0]], maxBindings() - 1));
	}

	return LayoutBindingTestResult(passed, String());
}